

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTFlightData.cpp
# Opt level: O2

bool __thiscall LTFlightData::validForAcCreate(LTFlightData *this,double simTime)

{
  size_type sVar1;
  reference ppVar2;
  bool bVar3;
  iterator *this_00;
  double dVar4;
  positionTy local_b0;
  positionTy local_68;
  
  std::recursive_mutex::lock(&this->dataAccessMutex);
  if (((this->acKey).key._M_string_length != 0) &&
     ((this->dynDataDeque).
      super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur !=
      (this->dynDataDeque).
      super__Deque_base<LTFlightData::FDDynamicData,_std::allocator<LTFlightData::FDDynamicData>_>.
      _M_impl.super__Deque_impl_data._M_start._M_cur)) {
    sVar1 = std::deque<positionTy,_std::allocator<positionTy>_>::size(&this->posDeque);
    if ((1 < sVar1) &&
       (dVar4 = (double)(~-(ulong)NAN(simTime) & (ulong)simTime |
                        (ulong)dataRefs.lastSimTime & -(ulong)NAN(simTime)),
       ((this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
        super__Deque_impl_data._M_start._M_cur)->_ts <= dVar4)) {
      this_00 = &(this->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl
                 .super__Deque_impl_data._M_start;
      ppVar2 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[](this_00,1);
      if (dVar4 < ppVar2->_ts) {
        DataRefs::GetViewPos();
        dVar4 = CoordDistance(&local_68,this_00->_M_cur);
        if (dVar4 <= (double)(dataRefs.fdStdDistance * 0x73c)) {
          DataRefs::GetViewPos();
          ppVar2 = std::_Deque_iterator<positionTy,_positionTy_&,_positionTy_*>::operator[]
                             (this_00,1);
          dVar4 = CoordDistance(&local_b0,ppVar2);
          if (dVar4 <= (double)(dataRefs.fdStdDistance * 0x73c)) {
            bVar3 = true;
            goto LAB_0015a42c;
          }
        }
      }
    }
  }
  bVar3 = false;
LAB_0015a42c:
  pthread_mutex_unlock((pthread_mutex_t *)&this->dataAccessMutex);
  return bVar3;
}

Assistant:

bool LTFlightData::validForAcCreate(double simTime) const
{
    // access guarded by a mutex
    std::lock_guard<std::recursive_mutex> lock (dataAccessMutex);

    // the obvious stuff first: we need basic data
    if ( empty() || dynDataDeque.empty() || posDeque.size() < 2 )
        return false;

    // simTime defaults to 'now'
    if (std::isnan(simTime))
        simTime = dataRefs.GetSimTime();

    // so we have two positions...
    // if it is _not_ one in the past, one in the future, then bail
    if (!(posDeque.front().ts() <= simTime && simTime < posDeque[1].ts()))
        return false;
    
    // So first pos is in the past, second in the future, great...
    // both are within limits in terms of distance?
    if (CoordDistance(dataRefs.GetViewPos(), posDeque.front()) > dataRefs.GetFdStdDistance_m() ||
        CoordDistance(dataRefs.GetViewPos(), posDeque[1]     ) > dataRefs.GetFdStdDistance_m())
        return false;

    // All checks passed
    return true;
}